

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void ParseIfil(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  WORD minor;
  WORD major;
  DWORD chunklen_local;
  DWORD chunkid_local;
  FileReader *f_local;
  SFFile *sf2_local;
  
  if (chunklen != 4) {
    uVar3 = __cxa_allocate_exception(1);
    __cxa_throw(uVar3,&CBadForm::typeinfo,0);
  }
  iVar1 = read_uword(f);
  uVar2 = read_uword(f);
  if ((short)iVar1 != 2) {
    uVar3 = __cxa_allocate_exception(1);
    __cxa_throw(uVar3,&CBadVer::typeinfo,0);
  }
  sf2->MinorVersion = uVar2 & 0xffff;
  return;
}

Assistant:

static void ParseIfil(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	WORD major, minor;

	if (chunklen != 4)
	{
		throw CBadForm();
	}

	major = read_uword(f);
	minor = read_uword(f);

	if (major != 2)
	{
		throw CBadVer();
	}
	sf2->MinorVersion = minor;
}